

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

Trivia __thiscall
slang::parsing::Preprocessor::handleDefineDirective(Preprocessor *this,Token directive)

{
  SmallVector<slang::parsing::Token,_2UL> *this_00;
  flat_hash_map<std::string_view,_MacroDef> *this_01;
  group_type_pointer pgVar1;
  BumpAllocator *pBVar2;
  group_type_pointer pgVar3;
  value_type_pointer ppVar4;
  ulong uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  byte bVar12;
  SyntaxKind SVar13;
  int iVar14;
  uint uVar15;
  SourceLocation SVar16;
  undefined4 extraout_var;
  DefineDirectiveSyntax *left;
  uint64_t uVar17;
  Diagnostic *this_02;
  __extent_storage<18446744073709551615UL> _Var18;
  ulong uVar19;
  iterator __begin3;
  Trivia *this_03;
  basic_string_view<char,_std::char_traits<char>_> *__y;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  Token TVar27;
  string_view sVar28;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar29;
  basic_string_view<char,_std::char_traits<char>_> bVar30;
  SourceRange SVar31;
  string_view directive_00;
  string_view raw;
  Token local_110;
  ulong local_100;
  ulong local_f8;
  Token local_f0;
  MacroFormalArgumentListSyntax *formalArguments;
  MacroParser parser;
  Token directive_local;
  Trivia local_40;
  
  directive_local.info = directive.info;
  directive_local._0_8_ = directive._0_8_;
  formalArguments = (MacroFormalArgumentListSyntax *)0x0;
  Token::Token(&local_110);
  TVar27 = peek(this);
  bVar11 = LexerFacts::isKeyword(TVar27.kind);
  if (bVar11) {
    local_110 = consume(this);
  }
  else {
    local_110 = expect(this,Identifier);
  }
  this->inMacroBody = true;
  bVar11 = true;
  if ((local_110._0_4_ >> 0x10 & 1) == 0) {
    sVar28 = Token::valueText(&local_110);
    bVar11 = (this->lexerOptions).enableLegacyProtect;
    directive_00._M_str._0_1_ = bVar11;
    directive_00._M_len = (size_t)sVar28._M_str;
    directive_00._M_str._1_7_ = 0;
    SVar13 = LexerFacts::getDirectiveKind((LexerFacts *)sVar28._M_len,directive_00,bVar11);
    bVar11 = SVar13 != MacroUsage;
    if (bVar11) {
      SVar31 = Token::range(&local_110);
      addDiag(this,(DiagCode)0xd0004,SVar31);
    }
    TVar27 = peek(this);
    if (TVar27.kind == OpenParenthesis) {
      sVar28 = Token::rawText(&local_110);
      if (sVar28._M_len == 0) {
        bVar24 = false;
      }
      else {
        sVar28 = Token::rawText(&local_110);
        bVar24 = *sVar28._M_str == '\\';
      }
      TVar27 = peek(this);
      parser.pp._0_2_ = TVar27.kind;
      parser.pp._2_6_ = TVar27._2_6_;
      parser.buffer._M_ptr = (pointer)TVar27.info;
      sVar29 = Token::trivia((Token *)&parser);
      if (sVar29._M_extent._M_extent_value._M_extent_value != 0) {
        if (!bVar24 || sVar29._M_extent._M_extent_value._M_extent_value != 1) goto LAB_002c6ce9;
        sVar28 = Trivia::getRawText(sVar29._M_ptr);
        bVar30._M_str = " ";
        bVar30._M_len = 1;
        bVar24 = std::operator==(sVar28,bVar30);
        if (!bVar24) goto LAB_002c6ce9;
      }
      parser.pp._0_2_ = (TokenKind)this;
      parser.pp._2_6_ = (undefined6)((ulong)this >> 0x10);
      parser.buffer._M_ptr = (pointer)0x0;
      parser.buffer._M_extent._M_extent_value = 0;
      parser.currentIndex = 0;
      formalArguments = MacroParser::parseFormalArgumentList(&parser);
    }
  }
LAB_002c6ce9:
  (this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>.len = 0;
  this_00 = &this->scratchTokenBuffer;
  bVar24 = false;
  while( true ) {
    while( true ) {
      TVar27 = peek(this);
      _Var18._M_extent_value = (size_t)TVar27.info;
      parser.pp._0_2_ = TVar27.kind;
      parser.pp._2_6_ = TVar27._2_6_;
      parser.buffer._M_ptr = (pointer)_Var18._M_extent_value;
      if ((TokenKind)parser.pp != LineContinuation) break;
      raw = (string_view)consume(this);
      SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>
                (&this_00->super_SmallVectorBase<slang::parsing::Token>,(Token *)&raw);
      bVar24 = false;
    }
    if ((TokenKind)parser.pp == EndOfFile) break;
    sVar29 = Token::trivia((Token *)&parser);
    lVar23 = sVar29._M_extent._M_extent_value._M_extent_value << 4;
    bVar10 = false;
    do {
      _Var18 = sVar29._M_extent._M_extent_value;
      this_03 = sVar29._M_ptr;
      if (lVar23 == 0) break;
      if (this_03->kind == LineComment) {
        sVar28 = Trivia::getRawText(this_03);
        _Var18._M_extent_value = (size_t)sVar28._M_str;
        bVar24 = *(EVP_PKEY_CTX *)(_Var18._M_extent_value + (sVar28._M_len - 1)) ==
                 (EVP_PKEY_CTX)0x5c;
      }
      else {
        if ((this_03->kind == EndOfLine) && (!bVar24)) {
          bVar10 = true;
        }
        bVar24 = false;
      }
      sVar29._M_extent._M_extent_value = _Var18._M_extent_value;
      sVar29._M_ptr = this_03 + 1;
      lVar23 = lVar23 + -0x10;
    } while (!bVar10);
    if (bVar10) break;
    consume(this);
    if ((TokenKind)parser.pp == Identifier) {
      raw = Token::rawText((Token *)&parser);
      if ((raw._M_len == 0) || (raw._M_str[raw._M_len - 1] != '\\')) goto LAB_002c6f05;
      local_f0 = peek(this);
      sVar29 = Token::trivia(&local_f0);
      if ((sVar29._M_extent._M_extent_value._M_extent_value == 0) ||
         ((sVar29._M_ptr)->kind != EndOfLine)) goto LAB_002c6f05;
      pBVar2 = this->alloc;
      bVar30 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&raw,0,raw._M_len - 1);
      local_f0 = Token::withRawText((Token *)&parser,pBVar2,bVar30);
      SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>
                (&this_00->super_SmallVectorBase<slang::parsing::Token>,&local_f0);
      pBVar2 = this->alloc;
      SVar16 = Token::location((Token *)&parser);
      sVar28._M_str = "\\";
      sVar28._M_len = 1;
      Token::Token(&local_f0,pBVar2,LineContinuation,
                   (span<const_slang::parsing::Trivia,_18446744073709551615UL>)ZEXT816(0),sVar28,
                   (SourceLocation)
                   ((long)(((ulong)(uint)((int)((ulong)SVar16 >> 0x1c) + (int)raw._M_len) << 0x20) +
                          -0x100000000) >> 4 | (ulong)(SVar16._0_4_ & 0xfffffff)));
      SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>
                (&this_00->super_SmallVectorBase<slang::parsing::Token>,&local_f0);
      bVar24 = true;
    }
    else {
LAB_002c6f05:
      SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                (&this_00->super_SmallVectorBase<slang::parsing::Token>,(Token *)&parser);
    }
  }
  this->inMacroBody = false;
  pBVar2 = this->alloc;
  iVar14 = SmallVectorBase<slang::parsing::Token>::copy
                     (&this_00->super_SmallVectorBase<slang::parsing::Token>,(EVP_PKEY_CTX *)pBVar2,
                      (EVP_PKEY_CTX *)_Var18._M_extent_value);
  parser.pp._0_2_ = (TokenKind)iVar14;
  parser.pp._2_6_ = (undefined6)(CONCAT44(extraout_var,iVar14) >> 0x10);
  left = BumpAllocator::
         emplace<slang::syntax::DefineDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::MacroFormalArgumentListSyntax*&,std::span<slang::parsing::Token,18446744073709551615ul>>
                   (pBVar2,&directive_local,&local_110,&formalArguments,
                    (span<slang::parsing::Token,_18446744073709551615UL> *)&parser);
  this_01 = &this->macros;
  sVar28 = Token::valueText(&local_110);
  parser.pp._0_2_ = (TokenKind)sVar28._M_len;
  parser.pp._2_6_ = sVar28._M_len._2_6_;
  parser.buffer._M_ptr = (pointer)sVar28._M_str;
  uVar17 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this_01,
                      (basic_string_view<char,_std::char_traits<char>_> *)&parser);
  uVar21 = uVar17 >> ((byte)(this->macros).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                            .arrays.groups_size_index & 0x3f);
  lVar23 = (uVar17 & 0xff) * 4;
  uVar6 = (&UNK_0049e39c)[lVar23];
  uVar7 = (&UNK_0049e39d)[lVar23];
  uVar8 = (&UNK_0049e39e)[lVar23];
  bVar9 = (&UNK_0049e39f)[lVar23];
  uVar20 = 0;
  do {
    pgVar3 = (this->macros).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
             .arrays.groups_;
    pgVar1 = pgVar3 + uVar21;
    bVar12 = pgVar1->m[0xf].n;
    auVar25[0] = -(pgVar1->m[0].n == uVar6);
    auVar25[1] = -(pgVar1->m[1].n == uVar7);
    auVar25[2] = -(pgVar1->m[2].n == uVar8);
    auVar25[3] = -(pgVar1->m[3].n == bVar9);
    auVar25[4] = -(pgVar1->m[4].n == uVar6);
    auVar25[5] = -(pgVar1->m[5].n == uVar7);
    auVar25[6] = -(pgVar1->m[6].n == uVar8);
    auVar25[7] = -(pgVar1->m[7].n == bVar9);
    auVar25[8] = -(pgVar1->m[8].n == uVar6);
    auVar25[9] = -(pgVar1->m[9].n == uVar7);
    auVar25[10] = -(pgVar1->m[10].n == uVar8);
    auVar25[0xb] = -(pgVar1->m[0xb].n == bVar9);
    auVar25[0xc] = -(pgVar1->m[0xc].n == uVar6);
    auVar25[0xd] = -(pgVar1->m[0xd].n == uVar7);
    auVar25[0xe] = -(pgVar1->m[0xe].n == uVar8);
    auVar25[0xf] = -(bVar12 == bVar9);
    uVar15 = (uint)(ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe);
    if (uVar15 != 0) {
      ppVar4 = (this->macros).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
               .arrays.elements_;
      local_100 = uVar21;
      local_f8 = uVar20;
      do {
        iVar14 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> iVar14 & 1) == 0; iVar14 = iVar14 + 1) {
          }
        }
        __y = (basic_string_view<char,_std::char_traits<char>_> *)
              ((long)&ppVar4[uVar21 * 0xf].first._M_len + (ulong)(uint)(iVar14 << 5));
        bVar24 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                           ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            this_01,(basic_string_view<char,_std::char_traits<char>_> *)&parser,__y)
        ;
        if (bVar24) {
          if (*(char *)((long)&__y[1]._M_str + 4) == '\x01') {
            SVar31 = Token::range(&local_110);
            addDiag(this,(DiagCode)0xd0004,SVar31);
            goto LAB_002c728b;
          }
          if ((*(char *)((long)&__y[1]._M_str + 5) != '\0') || (bVar11)) goto LAB_002c728b;
          if ((((DefineDirectiveSyntax *)__y[1]._M_len != (DefineDirectiveSyntax *)0x0) ||
              (*(int *)&__y[1]._M_str != 0)) &&
             (bVar11 = isSameMacro(left,(DefineDirectiveSyntax *)__y[1]._M_len), !bVar11)) {
            SVar31 = Token::range(&local_110);
            this_02 = addDiag(this,(DiagCode)0x290004,SVar31);
            sVar28 = Token::valueText(&local_110);
            Diagnostic::operator<<(this_02,sVar28);
            SVar16 = Token::location((Token *)(__y[1]._M_len + 0x28));
            Diagnostic::addNote(this_02,(DiagCode)0xa0001,SVar16);
          }
          goto LAB_002c70ae;
        }
        uVar15 = uVar15 - 1 & uVar15;
      } while (uVar15 != 0);
      bVar12 = pgVar3[uVar21].m[0xf].n;
      uVar20 = local_f8;
      uVar21 = local_100;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar17 & 7] & bVar12) == 0) break;
    uVar19 = (this->macros).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
             .arrays.groups_size_mask;
    lVar23 = uVar21 + uVar20;
    uVar20 = uVar20 + 1;
    uVar21 = lVar23 + 1U & uVar19;
  } while (uVar20 <= uVar19);
  if (!bVar11) {
LAB_002c70ae:
    raw = Token::valueText(&local_110);
    uVar17 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this_01
                        ,&raw);
    uVar19 = uVar17 >> ((byte)(this_01->table_).
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                              .arrays.groups_size_index & 0x3f);
    lVar23 = (uVar17 & 0xff) * 4;
    uVar6 = (&UNK_0049e39c)[lVar23];
    uVar7 = (&UNK_0049e39d)[lVar23];
    uVar8 = (&UNK_0049e39e)[lVar23];
    bVar9 = (&UNK_0049e39f)[lVar23];
    uVar21 = (ulong)((uint)uVar17 & 7);
    uVar22 = 0;
    uVar20 = uVar19;
    do {
      pgVar3 = (this->macros).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
               .arrays.groups_;
      pgVar1 = pgVar3 + uVar20;
      bVar12 = pgVar1->m[0xf].n;
      auVar26[0] = -(pgVar1->m[0].n == uVar6);
      auVar26[1] = -(pgVar1->m[1].n == uVar7);
      auVar26[2] = -(pgVar1->m[2].n == uVar8);
      auVar26[3] = -(pgVar1->m[3].n == bVar9);
      auVar26[4] = -(pgVar1->m[4].n == uVar6);
      auVar26[5] = -(pgVar1->m[5].n == uVar7);
      auVar26[6] = -(pgVar1->m[6].n == uVar8);
      auVar26[7] = -(pgVar1->m[7].n == bVar9);
      auVar26[8] = -(pgVar1->m[8].n == uVar6);
      auVar26[9] = -(pgVar1->m[9].n == uVar7);
      auVar26[10] = -(pgVar1->m[10].n == uVar8);
      auVar26[0xb] = -(pgVar1->m[0xb].n == bVar9);
      auVar26[0xc] = -(pgVar1->m[0xc].n == uVar6);
      auVar26[0xd] = -(pgVar1->m[0xd].n == uVar7);
      auVar26[0xe] = -(pgVar1->m[0xe].n == uVar8);
      auVar26[0xf] = -(bVar12 == bVar9);
      uVar15 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe);
      if (uVar15 != 0) {
        ppVar4 = (this->macros).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                 .arrays.elements_;
        local_100 = uVar21;
        local_f8 = uVar20;
        do {
          iVar14 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> iVar14 & 1) == 0; iVar14 = iVar14 + 1) {
            }
          }
          _Var18._M_extent_value =
               (long)&ppVar4[uVar20 * 0xf].first._M_len + (ulong)(uint)(iVar14 << 5);
          bVar11 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                             ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              this_01,&raw,
                              (basic_string_view<char,_std::char_traits<char>_> *)
                              _Var18._M_extent_value);
          if (bVar11) goto LAB_002c7238;
          uVar15 = uVar15 - 1 & uVar15;
        } while (uVar15 != 0);
        bVar12 = pgVar3[uVar20].m[0xf].n;
        uVar20 = local_f8;
        uVar21 = local_100;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[uVar21] & bVar12) == 0) break;
      uVar5 = (this->macros).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
              .arrays.groups_size_mask;
      lVar23 = uVar20 + uVar22;
      uVar22 = uVar22 + 1;
      uVar20 = lVar23 + 1U & uVar5;
    } while (uVar22 <= uVar5);
    if ((this->macros).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
        .size_ctrl.size <
        (this->macros).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)&parser,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
                  *)this_01,uVar19,uVar17,(try_emplace_args_t *)&local_f0,&raw);
      _Var18 = parser.buffer._M_extent;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)&parser,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
                  *)this_01,uVar17,(try_emplace_args_t *)&local_f0,&raw);
      _Var18 = parser.buffer._M_extent;
    }
LAB_002c7238:
    ((basic_string_view<char,_std::char_traits<char>_> *)(_Var18._M_extent_value + 0x10))->_M_len =
         (size_t)left;
    *(undefined4 *)
     &((basic_string_view<char,_std::char_traits<char>_> *)(_Var18._M_extent_value + 0x10))->_M_str
         = 0;
    *(undefined2 *)
     ((long)&((basic_string_view<char,_std::char_traits<char>_> *)(_Var18._M_extent_value + 0x10))->
             _M_str + 4) = 0;
  }
LAB_002c728b:
  Trivia::Trivia(&local_40,Directive,(SyntaxNode *)left);
  return local_40;
}

Assistant:

Trivia Preprocessor::handleDefineDirective(Token directive) {
    MacroFormalArgumentListSyntax* formalArguments = nullptr;
    bool bad = false;

    // Next token should be the macro name. We allow the name to be
    // a keyword token for compatibility with other tools.
    Token name;
    if (LF::isKeyword(peek().kind))
        name = consume();
    else
        name = expect(TokenKind::Identifier);

    inMacroBody = true;
    if (name.isMissing())
        bad = true;
    else {
        if (LF::getDirectiveKind(name.valueText(), lexerOptions.enableLegacyProtect) !=
            SyntaxKind::MacroUsage) {
            addDiag(diag::InvalidMacroName, name.range());
            bad = true;
        }

        // Check if this is a function-like macro, which requires an opening paren with no
        // leading space unless the macro name is escaped, in which case we have to allow one space.
        if (peek(TokenKind::OpenParenthesis)) {
            bool isEscaped = !name.rawText().empty() && name.rawText()[0] == '\\';
            auto trivia = peek().trivia();
            if (trivia.empty() ||
                (isEscaped && trivia.size() == 1 && trivia[0].getRawText() == " "sv)) {
                MacroParser parser(*this);
                formalArguments = parser.parseFormalArgumentList();
            }
        }
    }

    // consume all remaining tokens as macro text
    scratchTokenBuffer.clear();
    bool hasContinuation = false;
    while (true) {
        // Figure out when to stop consuming macro text. This involves looking for new lines in the
        // trivia of each token as we grab it. If there's a new line without a preceeding line
        // continuation token we know the macro is finished.
        Token t = peek();
        if (t.kind == TokenKind::EndOfFile)
            break;
        if (t.kind == TokenKind::LineContinuation) {
            hasContinuation = false;
            scratchTokenBuffer.push_back(consume());
            continue;
        }

        bool done = false;
        auto triviaList = t.trivia();
        for (const Trivia& trivia : triviaList) {
            switch (trivia.kind) {
                case TriviaKind::EndOfLine:
                    if (hasContinuation)
                        hasContinuation = false;
                    else
                        done = true;
                    break;
                case TriviaKind::LineComment:
                    // A line comment can have a trailing line continuation.
                    hasContinuation = (trivia.getRawText().back() == '\\');
                    break;
                default:
                    hasContinuation = false;
                    break;
            }
            if (done)
                break;
        }
        if (done)
            break;

        consume();

        if (t.kind == TokenKind::Identifier) {
            // Escaped identifiers that end in a backslash act as a continuation.
            auto raw = t.rawText();
            if (!raw.empty() && raw.back() == '\\') {
                auto nextTrivia = peek().trivia();
                if (!nextTrivia.empty() && nextTrivia[0].kind == TriviaKind::EndOfLine) {
                    hasContinuation = true;
                    scratchTokenBuffer.push_back(
                        t.withRawText(alloc, raw.substr(0, raw.size() - 1)));
                    scratchTokenBuffer.push_back(Token(alloc, TokenKind::LineContinuation, {}, "\\",
                                                       t.location() + raw.size() - 1));
                    continue;
                }
            }
        }

        scratchTokenBuffer.push_back(t);
    }
    inMacroBody = false;

    auto result = alloc.emplace<DefineDirectiveSyntax>(directive, name, formalArguments,
                                                       scratchTokenBuffer.copy(alloc));

    if (auto it = macros.find(name.valueText()); it != macros.end()) {
        if (it->second.builtIn) {
            addDiag(diag::InvalidMacroName, name.range());
            bad = true;
        }
        else if (it->second.commandLine)
            bad = true; // not really bad, but commandLine args has precedence so we skip this
        else if (!bad && it->second.valid() && !isSameMacro(*result, *it->second.syntax)) {
            auto& diag = addDiag(diag::RedefiningMacro, name.range());
            diag << name.valueText();
            diag.addNote(diag::NotePreviousDefinition, it->second.syntax->name.location());
        }
    }

    if (!bad)
        macros[name.valueText()] = result;
    return Trivia(TriviaKind::Directive, result);
}